

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_hash_keyless_list_dfs(lyd_node *child,uint32_t *hash)

{
  LYS_NODE LVar1;
  uint32_t uVar2;
  int iVar3;
  
  if (child != (lyd_node *)0x0) {
    do {
      LVar1 = child->schema->nodetype;
      if ((int)LVar1 < 0x10) {
        if (LVar1 == LYS_CONTAINER) {
LAB_001663c1:
          lyd_hash_keyless_list_dfs(child->child,hash);
        }
        else {
          if ((LVar1 != LYS_LEAF) && (LVar1 != LYS_LEAFLIST)) {
LAB_001663db:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x156,"void lyd_hash_keyless_list_dfs(struct lyd_node *, uint32_t *)");
          }
LAB_001663a1:
          uVar2 = dict_hash_multi(*hash,(char *)&child->hash,4);
          *hash = uVar2;
        }
      }
      else {
        if (LVar1 != LYS_LIST) {
          if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) goto LAB_001663db;
          goto LAB_001663a1;
        }
        iVar3 = lyd_list_has_keys(child);
        if (iVar3 != 0) goto LAB_001663c1;
      }
      child = child->next;
    } while (child != (lyd_node *)0x0);
  }
  return;
}

Assistant:

static void
lyd_hash_keyless_list_dfs(struct lyd_node *child, uint32_t *hash)
{
    LY_TREE_FOR(child, child) {
        switch (child->schema->nodetype) {
        case LYS_CONTAINER:
            lyd_hash_keyless_list_dfs(child->child, hash);
            break;
        case LYS_LIST:
            /* ignore lists with missing keys */
            if (lyd_list_has_keys(child)) {
                lyd_hash_keyless_list_dfs(child->child, hash);
            }
            break;
        case LYS_LEAFLIST:
        case LYS_ANYXML:
        case LYS_ANYDATA:
        case LYS_LEAF:
            *hash = dict_hash_multi(*hash, (char *)&child->hash, sizeof child->hash);
            break;
        default:
            assert(0);
        }
    }
}